

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O0

void __thiscall
CPU::Z80::Processor<Enterprise::ConcreteMachine<true,_true>,_false,_false>::copy_program
          (Processor<Enterprise::ConcreteMachine<true,_true>,_false,_false> *this,MicroOp *source,
          vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
          *destination)

{
  bool bVar1;
  long local_30;
  size_t pointer;
  size_t length;
  vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
  *destination_local;
  MicroOp *source_local;
  Processor<Enterprise::ConcreteMachine<true,_true>,_false,_false> *this_local;
  
  pointer = 0;
  while( true ) {
    bVar1 = ProcessorStorage::is_terminal(source[pointer].type);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pointer = pointer + 1;
  }
  local_30 = 0;
  while( true ) {
    while ((source[local_30].machine_cycle.was_requested & 1U) != 0) {
      local_30 = local_30 + 1;
    }
    std::
    vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
    ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp_const&>
              ((vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
                *)destination,source + local_30);
    bVar1 = ProcessorStorage::is_terminal(source[local_30].type);
    if (bVar1) break;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
		::copy_program(const MicroOp *source, std::vector<MicroOp> &destination) {
	std::size_t length = 0;
	while(!is_terminal(source[length].type)) length++;
	std::size_t pointer = 0;
	while(true) {
		// TODO: This test is duplicated from assemble_page; can a better factoring be found?
		// Skip optional waits if this instance doesn't use the wait line.
		if(source[pointer].machine_cycle.was_requested && !uses_wait_line) {
			pointer++;
			continue;
		}

		destination.emplace_back(source[pointer]);
		if(is_terminal(source[pointer].type)) break;
		pointer++;
	}
}